

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O1

void __thiscall
TPZBlackOilAnalysis::PostProcess(TPZBlackOilAnalysis *this,TPZVec<double> *loc,ostream *out)

{
  double dVar1;
  ostream *poVar2;
  
  dVar1 = this->fSimulationTime;
  std::__ostream_insert<char,std::char_traits<char>>(out,"\nSOLUTION #",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(out,this->fCurrentStep);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," AT TIME = ",0xb);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  TPZAnalysis::PostProcess((TPZAnalysis *)this,loc,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\n***************************************\n",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void TPZBlackOilAnalysis::PostProcess(TPZVec<REAL> &loc, std::ostream &out){
    REAL T = this->fSimulationTime;
    out << "\nSOLUTION #" << this->fCurrentStep << " AT TIME = " << T << std::endl;
    TPZLinearAnalysis::PostProcess(loc, out);
    out << "\n***************************************\n" << std::endl;
}